

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O0

int ndn_forwarder_add_route(ndn_face_intf_t *face,uint8_t *prefix,size_t length)

{
  ndn_fib_entry_t *pnVar1;
  ndn_bitset_t nVar2;
  ndn_fib_entry_t *fib_entry;
  int ret;
  size_t length_local;
  uint8_t *prefix_local;
  ndn_face_intf_t *face_local;
  
  if (face == (ndn_face_intf_t *)0x0) {
    face_local._4_4_ = -0x10;
  }
  else if (face->face_id < (forwarder.facetab)->capacity) {
    face_local._4_4_ = tlv_check_type_length(prefix,length,7);
    if (face_local._4_4_ == 0) {
      pnVar1 = ndn_fib_find_or_insert(forwarder.fib,prefix,length);
      if (pnVar1 == (ndn_fib_entry_t *)0x0) {
        face_local._4_4_ = -0x35;
      }
      else {
        nVar2 = bitset_set(pnVar1->nexthop,(ulong)face->face_id);
        pnVar1->nexthop = nVar2;
        face_local._4_4_ = 0;
      }
    }
  }
  else {
    face_local._4_4_ = -0x36;
  }
  return face_local._4_4_;
}

Assistant:

int
ndn_forwarder_add_route(ndn_face_intf_t* face, uint8_t* prefix, size_t length){
  int ret;
  ndn_fib_entry_t* fib_entry;

  if(face == NULL)
    return NDN_INVALID_POINTER;
  if(face->face_id >= forwarder.facetab->capacity)
    return NDN_FWD_INVALID_FACE;
  ret = tlv_check_type_length(prefix, length, TLV_Name);
  if(ret != NDN_SUCCESS)
    return ret;

  fib_entry = ndn_fib_find_or_insert(forwarder.fib, prefix, length);
  if (fib_entry == NULL)
    return NDN_FWD_FIB_FULL;
  fib_entry->nexthop = bitset_set(fib_entry->nexthop, face->face_id);
  return NDN_SUCCESS;
}